

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O3

float __thiscall
squaredloss::getUpdate
          (squaredloss *this,float prediction,float label,float update_scale,float pred_per_update)

{
  float fVar1;
  float fVar2;
  
  fVar2 = label - prediction;
  if (1e-06 <= update_scale * pred_per_update) {
    fVar1 = expf(update_scale * -2.0 * pred_per_update);
    fVar2 = (fVar2 * (1.0 - fVar1)) / pred_per_update;
  }
  else {
    fVar2 = (fVar2 + fVar2) * update_scale;
  }
  return fVar2;
}

Assistant:

float getUpdate(float prediction, float label, float update_scale, float pred_per_update)
  {
    if (update_scale * pred_per_update < 1e-6)
    {
      /* When exp(-eta_t)~= 1 we replace 1-exp(-eta_t)
       * with its first order Taylor expansion around 0
       * to avoid catastrophic cancellation.
       */
      return 2.f * (label - prediction) * update_scale;
    }
    return (label - prediction) * (1.f - correctedExp(-2.f * update_scale * pred_per_update)) / pred_per_update;
  }